

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> __thiscall
llvm::yaml::Input::createHNodes(Input *this,Node *N)

{
  StringRef SVar1;
  ScalarNode *pSVar2;
  __single_object this_00;
  __single_object this_01;
  bool bVar3;
  ret_type this_02;
  pointer pSVar4;
  pointer pMVar5;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> *this_03;
  undefined8 in_RDX;
  StringRef SVar6;
  StringRef SVar7;
  Twine local_258;
  unique_ptr<llvm::yaml::Input::EmptyHNode,_std::default_delete<llvm::yaml::Input::EmptyHNode>_>
  local_240;
  pointer local_238;
  char *pcStack_230;
  undefined1 local_220 [8];
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> ValueHNode;
  pointer pbStack_1f8;
  StringRef KeyStr_1;
  Twine local_1d0;
  Node *local_1b8;
  Node *Value;
  ScalarNode *Key;
  Node *KeyNode;
  KeyValueNode *KVN;
  iterator __end5;
  iterator __begin5;
  MappingNode *__range5;
  __single_object mapHNode;
  MappingNode *Map;
  unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_> Entry;
  Node *SN_1;
  iterator __end4;
  iterator __begin4;
  SequenceNode *__range4;
  __single_object SQHNode;
  SequenceNode *SQ;
  StringRef local_130;
  __uniq_ptr_impl<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_> local_120;
  StringRef ValueCopy;
  BlockScalarNode *BSN;
  unique_ptr<llvm::yaml::Input::ScalarHNode,_std::default_delete<llvm::yaml::Input::ScalarHNode>_>
  local_100;
  StringRef local_f8;
  StringRef local_e8;
  AlignedCharArrayUnion<void_*> local_d8;
  StringRef KeyStr;
  ScalarNode *SN;
  SmallString<128U> StringStorage;
  Node *N_local;
  Input *this_local;
  
  StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.InlineElts.
  _120_8_ = in_RDX;
  SmallString<128U>::SmallString((SmallString<128U> *)&SN);
  this_02 = dyn_cast<llvm::yaml::ScalarNode,llvm::yaml::Node>
                      ((Node *)StringStorage.super_SmallVector<char,_128U>.
                               super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
  if (this_02 == (ret_type)0x0) {
    ValueCopy.Length =
         (size_t)dyn_cast<llvm::yaml::BlockScalarNode,llvm::yaml::Node>
                           ((Node *)StringStorage.super_SmallVector<char,_128U>.
                                    super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
    if ((ret_type)ValueCopy.Length == (ret_type)0x0) {
      SQHNode._M_t.
      super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
      ._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
      .super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>._M_head_impl =
           (__uniq_ptr_data<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>,_true,_true>
            )dyn_cast<llvm::yaml::SequenceNode,llvm::yaml::Node>
                       ((Node *)StringStorage.super_SmallVector<char,_128U>.
                                super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
      if ((tuple<llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
           )SQHNode._M_t.
            super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
            ._M_t.
            super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
            .super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>._M_head_impl ==
          (_Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>)0x0) {
        mapHNode._M_t.
        super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
        ._M_t.
        super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
        .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>._M_head_impl =
             (__uniq_ptr_data<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>,_true,_true>
              )dyn_cast<llvm::yaml::MappingNode,llvm::yaml::Node>
                         ((Node *)StringStorage.super_SmallVector<char,_128U>.
                                  super_SmallVectorStorage<char,_128U>.InlineElts._120_8_);
        if ((tuple<llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
            )mapHNode._M_t.
             super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
             .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>._M_head_impl ==
            (_Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>)0x0) {
          bVar3 = isa<llvm::yaml::NullNode,llvm::yaml::Node*>
                            ((Node **)(StringStorage.super_SmallVector<char,_128U>.
                                       super_SmallVectorStorage<char,_128U>.InlineElts + 0x78));
          if (bVar3) {
            std::make_unique<llvm::yaml::Input::EmptyHNode,llvm::yaml::Node*&>((Node **)&local_240);
            std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
            ::
            unique_ptr<llvm::yaml::Input::EmptyHNode,std::default_delete<llvm::yaml::Input::EmptyHNode>,void>
                      ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
                        *)this,&local_240);
            std::
            unique_ptr<llvm::yaml::Input::EmptyHNode,_std::default_delete<llvm::yaml::Input::EmptyHNode>_>
            ::~unique_ptr(&local_240);
          }
          else {
            Twine::Twine(&local_258,"unknown node kind");
            setError((Input *)N,
                     (Node *)StringStorage.super_SmallVector<char,_128U>.
                             super_SmallVectorStorage<char,_128U>.InlineElts._120_8_,&local_258);
            std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
            ::unique_ptr<std::default_delete<llvm::yaml::Input::HNode>,void>
                      ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
                        *)this,(nullptr_t)0x0);
          }
        }
        else {
          std::make_unique<llvm::yaml::Input::MapHNode,llvm::yaml::Node*&>((Node **)&__range5);
          this_00._M_t.
          super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
          .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>._M_head_impl =
               mapHNode._M_t.
               super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
               .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>._M_head_impl;
          __end5 = MappingNode::begin((MappingNode *)
                                      mapHNode._M_t.
                                      super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                                      .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>.
                                      _M_head_impl);
          KVN = (KeyValueNode *)
                MappingNode::end((MappingNode *)
                                 this_00._M_t.
                                 super___uniq_ptr_impl<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Input::MapHNode_*,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                                 .super__Head_base<0UL,_llvm::yaml::Input::MapHNode_*,_false>.
                                 _M_head_impl);
          while (bVar3 = basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                         ::operator!=(&__end5,(basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                                               *)&KVN), bVar3) {
            KeyNode = &basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>
                       ::operator*(&__end5)->super_Node;
            Key = (ScalarNode *)KeyValueNode::getKey((KeyValueNode *)KeyNode);
            Value = &dyn_cast_or_null<llvm::yaml::ScalarNode,llvm::yaml::Node>((Node *)Key)->
                     super_Node;
            local_1b8 = KeyValueNode::getValue((KeyValueNode *)KeyNode);
            pSVar2 = Key;
            if ((Value == (Node *)0x0) || (local_1b8 == (Node *)0x0)) {
              if (Value == (Node *)0x0) {
                Twine::Twine(&local_1d0,"Map key must be a scalar");
                setError((Input *)N,&pSVar2->super_Node,&local_1d0);
              }
              pSVar2 = Key;
              if (local_1b8 == (Node *)0x0) {
                Twine::Twine((Twine *)&KeyStr_1.Length,"Map value must not be empty");
                setError((Input *)N,&pSVar2->super_Node,(Twine *)&KeyStr_1.Length);
              }
              break;
            }
            SmallVectorImpl<char>::clear((SmallVectorImpl<char> *)&SN);
            SVar7 = ScalarNode::getValue((ScalarNode *)Value,(SmallVectorImpl<char> *)&SN);
            KeyStr_1.Data = (char *)SVar7.Length;
            bVar3 = SmallVectorBase::empty((SmallVectorBase *)&SN);
            SVar6.Length = (size_t)KeyStr_1.Data;
            SVar6.Data = SVar7.Data;
            if (!bVar3) {
              SVar6 = SmallString<128U>::str((SmallString<128U> *)&SN);
              ValueHNode._M_t.
              super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
              ._M_t.
              super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
              .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl =
                   (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
                    )SVar6.Data;
              SVar6 = StringRef::
                      copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                                ((StringRef *)&ValueHNode,
                                 (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                                 &N[1].Anchor);
            }
            KeyStr_1.Data = (char *)SVar6.Length;
            pbStack_1f8 = (pointer)SVar6.Data;
            createHNodes((Input *)local_220,N);
            bVar3 = std::error_code::operator_cast_to_bool((error_code *)&N[1].SourceRange.End);
            if (!bVar3) {
              pMVar5 = std::
                       unique_ptr<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                       ::operator->((unique_ptr<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                                     *)&__range5);
              local_238 = pbStack_1f8;
              pcStack_230 = KeyStr_1.Data;
              SVar7.Length = (size_t)KeyStr_1.Data;
              SVar7.Data = (char *)pbStack_1f8;
              this_03 = StringMap<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_llvm::MallocAllocator>
                        ::operator[](&pMVar5->Mapping,SVar7);
              std::
              unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
              operator=(this_03,(unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                                 *)local_220);
            }
            std::
            unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
            ~unique_ptr((unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                         *)local_220);
            if (bVar3) break;
            basic_collection_iterator<llvm::yaml::MappingNode,_llvm::yaml::KeyValueNode>::operator++
                      (&__end5);
          }
          std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>::
          unique_ptr<llvm::yaml::Input::MapHNode,std::default_delete<llvm::yaml::Input::MapHNode>,void>
                    ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
                      *)this,(unique_ptr<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                              *)&__range5);
          std::
          unique_ptr<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
          ::~unique_ptr((unique_ptr<llvm::yaml::Input::MapHNode,_std::default_delete<llvm::yaml::Input::MapHNode>_>
                         *)&__range5);
        }
      }
      else {
        std::make_unique<llvm::yaml::Input::SequenceHNode,llvm::yaml::Node*&>((Node **)&__range4);
        this_01._M_t.
        super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
        ._M_t.
        super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
        .super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>._M_head_impl =
             SQHNode._M_t.
             super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
             .super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>._M_head_impl;
        __end4 = SequenceNode::begin((SequenceNode *)
                                     SQHNode._M_t.
                                     super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                                     .
                                     super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>
                                     ._M_head_impl);
        SN_1 = (Node *)SequenceNode::end((SequenceNode *)
                                         this_01._M_t.
                                         super___uniq_ptr_impl<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_llvm::yaml::Input::SequenceHNode_*,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                                         .
                                         super__Head_base<0UL,_llvm::yaml::Input::SequenceHNode_*,_false>
                                         ._M_head_impl);
        while (bVar3 = basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::
                       operator!=(&__end4,(basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>
                                           *)&SN_1), bVar3) {
          Entry._M_t.
          super___uniq_ptr_impl<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_llvm::yaml::Input::HNode_*,_std::default_delete<llvm::yaml::Input::HNode>_>
          .super__Head_base<0UL,_llvm::yaml::Input::HNode_*,_false>._M_head_impl =
               (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
                )basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator*
                           (&__end4);
          createHNodes((Input *)&Map,N);
          bVar3 = std::error_code::operator_cast_to_bool((error_code *)&N[1].SourceRange.End);
          if (!bVar3) {
            pSVar4 = std::
                     unique_ptr<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                     ::operator->((unique_ptr<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                                   *)&__range4);
            std::
            vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
            ::push_back(&pSVar4->Entries,(value_type *)&Map);
          }
          std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
          ::~unique_ptr((unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                         *)&Map);
          if (bVar3) break;
          basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++(&__end4)
          ;
        }
        std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>::
        unique_ptr<llvm::yaml::Input::SequenceHNode,std::default_delete<llvm::yaml::Input::SequenceHNode>,void>
                  ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
                    *)this,(unique_ptr<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                            *)&__range4);
        std::
        unique_ptr<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
        ::~unique_ptr((unique_ptr<llvm::yaml::Input::SequenceHNode,_std::default_delete<llvm::yaml::Input::SequenceHNode>_>
                       *)&__range4);
      }
    }
    else {
      local_130 = BlockScalarNode::getValue((BlockScalarNode *)ValueCopy.Length);
      SVar6 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                        (&local_130,
                         (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)&N[1].Anchor
                        );
      ValueCopy.Data = (char *)SVar6.Length;
      local_120._M_t.
      super__Tuple_impl<0UL,_llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>.
      super__Head_base<0UL,_llvm::yaml::Stream_*,_false>._M_head_impl =
           (tuple<llvm::yaml::Stream_*,_std::default_delete<llvm::yaml::Stream>_>)SVar6.Data;
      std::make_unique<llvm::yaml::Input::ScalarHNode,llvm::yaml::Node*&,llvm::StringRef&>
                ((Node **)&SQ,
                 (StringRef *)
                 (StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                  InlineElts + 0x78));
      std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>::
      unique_ptr<llvm::yaml::Input::ScalarHNode,std::default_delete<llvm::yaml::Input::ScalarHNode>,void>
                ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>
                  *)this,(unique_ptr<llvm::yaml::Input::ScalarHNode,_std::default_delete<llvm::yaml::Input::ScalarHNode>_>
                          *)&SQ);
      std::
      unique_ptr<llvm::yaml::Input::ScalarHNode,_std::default_delete<llvm::yaml::Input::ScalarHNode>_>
      ::~unique_ptr((unique_ptr<llvm::yaml::Input::ScalarHNode,_std::default_delete<llvm::yaml::Input::ScalarHNode>_>
                     *)&SQ);
    }
  }
  else {
    SVar6 = ScalarNode::getValue(this_02,(SmallVectorImpl<char> *)&SN);
    KeyStr.Data = (char *)SVar6.Length;
    local_d8.buffer = (char  [8])SVar6.Data;
    bVar3 = SmallVectorBase::empty((SmallVectorBase *)&SN);
    SVar1.Length = (size_t)KeyStr.Data;
    SVar1.Data = (char *)local_d8.buffer;
    if (!bVar3) {
      local_f8 = SmallString<128U>::str((SmallString<128U> *)&SN);
      local_e8 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                           (&local_f8,
                            (BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL> *)
                            &N[1].Anchor);
      SVar1 = local_e8;
    }
    KeyStr.Data = (char *)SVar1.Length;
    local_d8.buffer = (char  [8])SVar1.Data;
    std::make_unique<llvm::yaml::Input::ScalarHNode,llvm::yaml::Node*&,llvm::StringRef&>
              ((Node **)&local_100,
               (StringRef *)
               (StringStorage.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                InlineElts + 0x78));
    std::unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>>::
    unique_ptr<llvm::yaml::Input::ScalarHNode,std::default_delete<llvm::yaml::Input::ScalarHNode>,void>
              ((unique_ptr<llvm::yaml::Input::HNode,std::default_delete<llvm::yaml::Input::HNode>> *
               )this,&local_100);
    std::
    unique_ptr<llvm::yaml::Input::ScalarHNode,_std::default_delete<llvm::yaml::Input::ScalarHNode>_>
    ::~unique_ptr(&local_100);
  }
  SmallString<128U>::~SmallString((SmallString<128U> *)&SN);
  return (__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
          )(__uniq_ptr_data<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Input::HNode> Input::createHNodes(Node *N) {
  SmallString<128> StringStorage;
  if (ScalarNode *SN = dyn_cast<ScalarNode>(N)) {
    StringRef KeyStr = SN->getValue(StringStorage);
    if (!StringStorage.empty()) {
      // Copy string to permanent storage
      KeyStr = StringStorage.str().copy(StringAllocator);
    }
    return std::make_unique<ScalarHNode>(N, KeyStr);
  } else if (BlockScalarNode *BSN = dyn_cast<BlockScalarNode>(N)) {
    StringRef ValueCopy = BSN->getValue().copy(StringAllocator);
    return std::make_unique<ScalarHNode>(N, ValueCopy);
  } else if (SequenceNode *SQ = dyn_cast<SequenceNode>(N)) {
    auto SQHNode = std::make_unique<SequenceHNode>(N);
    for (Node &SN : *SQ) {
      auto Entry = createHNodes(&SN);
      if (EC)
        break;
      SQHNode->Entries.push_back(std::move(Entry));
    }
    return std::move(SQHNode);
  } else if (MappingNode *Map = dyn_cast<MappingNode>(N)) {
    auto mapHNode = std::make_unique<MapHNode>(N);
    for (KeyValueNode &KVN : *Map) {
      Node *KeyNode = KVN.getKey();
      ScalarNode *Key = dyn_cast_or_null<ScalarNode>(KeyNode);
      Node *Value = KVN.getValue();
      if (!Key || !Value) {
        if (!Key)
          setError(KeyNode, "Map key must be a scalar");
        if (!Value)
          setError(KeyNode, "Map value must not be empty");
        break;
      }
      StringStorage.clear();
      StringRef KeyStr = Key->getValue(StringStorage);
      if (!StringStorage.empty()) {
        // Copy string to permanent storage
        KeyStr = StringStorage.str().copy(StringAllocator);
      }
      auto ValueHNode = createHNodes(Value);
      if (EC)
        break;
      mapHNode->Mapping[KeyStr] = std::move(ValueHNode);
    }
    return std::move(mapHNode);
  } else if (isa<NullNode>(N)) {
    return std::make_unique<EmptyHNode>(N);
  } else {
    setError(N, "unknown node kind");
    return nullptr;
  }
}